

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_from_entries.cpp
# Opt level: O3

void duckdb::MapFromEntriesFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong uVar1;
  char cVar2;
  reference pvVar3;
  
  uVar1 = *(ulong *)(args + 0x18);
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::MapUtil::ReinterpretMap(result,pvVar3,uVar1);
  duckdb::MapVector::MapConversionVerify(result,uVar1);
  duckdb::Vector::Verify((ulong)result);
  cVar2 = duckdb::DataChunk::AllConstant();
  if (cVar2 != '\0') {
    duckdb::Vector::SetVectorType((VectorType)result);
    return;
  }
  return;
}

Assistant:

static void MapFromEntriesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto count = args.size();

	MapUtil::ReinterpretMap(result, args.data[0], count);
	MapVector::MapConversionVerify(result, count);
	result.Verify(count);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}